

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_mount.c
# Opt level: O0

LY_ERR schema_mount_validate
                 (lysc_ext_instance *ext,lyd_node *sibling,lyd_node *dep_tree,lyd_type data_type,
                 uint32_t val_opts,lyd_node **diff)

{
  LY_ERR LVar1;
  lyd_node *plVar2;
  undefined8 in_stack_fffffffffffffef8;
  undefined4 uVar3;
  ly_ctx *local_100;
  ly_ctx *local_f8;
  lyd_node **local_f0;
  lyd_node **local_d0;
  ly_ctx *local_c0;
  ly_set *local_a0;
  ly_set *ref_set;
  lyd_node *plStack_90;
  ly_bool ext_data_free;
  lyd_node *diff_parent;
  lyd_node *ext_diff;
  lyd_node *op_tree;
  lyd_node *orig_parent;
  lyd_node *ref_first;
  lyd_node *ext_data;
  lyd_node *iter;
  ly_err_item *err;
  uint32_t i;
  uint32_t temp_lo;
  uint32_t *prev_lo;
  lyd_node **pplStack_38;
  LY_ERR ret;
  lyd_node **diff_local;
  uint32_t val_opts_local;
  lyd_type data_type_local;
  lyd_node *dep_tree_local;
  lyd_node *sibling_local;
  lysc_ext_instance *ext_local;
  
  uVar3 = (undefined4)((ulong)in_stack_fffffffffffffef8 >> 0x20);
  prev_lo._4_4_ = 0;
  err._4_4_ = 6;
  ref_first = (lyd_node *)0x0;
  orig_parent = (lyd_node *)0x0;
  pplStack_38 = diff;
  diff_local._0_4_ = val_opts;
  diff_local._4_4_ = data_type;
  _val_opts_local = dep_tree;
  dep_tree_local = sibling;
  sibling_local = (lyd_node *)ext;
  op_tree = lyd_parent(sibling);
  diff_parent = (lyd_node *)0x0;
  plStack_90 = (lyd_node *)0x0;
  ref_set._7_1_ = '\0';
  local_a0 = (ly_set *)0x0;
  if (dep_tree_local == (lyd_node *)0x0) {
    lyplg_ext_compile_log
              ((lysc_ctx *)0x0,(lysc_ext_instance *)sibling_local,LY_LLERR,LY_EINT,
               "Internal error (%s:%d).",
               "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/plugins_exts/schema_mount.c"
               ,CONCAT44(uVar3,0x393));
    return LY_EINT;
  }
  prev_lo._4_4_ =
       lyplg_ext_get_data(*(ly_ctx **)&sibling_local->parent->field_0,
                          (lysc_ext_instance *)sibling_local,&ref_first,
                          (ly_bool *)((long)&ref_set + 7));
  if (prev_lo._4_4_ == LY_SUCCESS) {
    for (ext_data = ref_first; ext_data != (lyd_node *)0x0; ext_data = ext_data->next) {
      if ((ext_data->flags & 4) != 0) {
        lyplg_ext_compile_log
                  ((lysc_ctx *)0x0,(lysc_ext_instance *)sibling_local,LY_LLERR,LY_EINVAL,
                   "Provided ext data have not been validated.");
        prev_lo._4_4_ = LY_EINVAL;
        goto LAB_0020984b;
      }
    }
    if (dep_tree_local->schema == (lysc_node *)0x0) {
      local_c0 = (ly_ctx *)dep_tree_local[2].schema;
    }
    else {
      local_c0 = dep_tree_local->schema->module->ctx;
    }
    prev_lo._4_4_ =
         schema_mount_dup_parent_ref
                   ((lysc_ext_instance *)sibling_local,op_tree,ref_first,local_c0,&local_a0);
    if (prev_lo._4_4_ == LY_SUCCESS) {
      if (diff_local._4_4_ != LYD_TYPE_DATA_YANG) {
        ext_diff = dep_tree_local;
      }
      LVar1 = lyd_unlink_siblings(dep_tree_local);
      if (LVar1 == LY_SUCCESS) {
        for (ext_data = dep_tree_local; ext_data != (lyd_node *)0x0; ext_data = ext_data->next) {
          ext_data->flags = ext_data->flags & 0xfffffff7;
        }
        if (local_a0->count != 0) {
          prev_lo._4_4_ =
               lyd_insert_sibling(dep_tree_local,*(local_a0->field_2).dnodes,&dep_tree_local);
          if (prev_lo._4_4_ != LY_SUCCESS) goto LAB_0020984b;
          prev_lo._4_4_ = LY_SUCCESS;
        }
        _i = ly_temp_log_options((uint32_t *)((long)&err + 4));
        if (diff_local._4_4_ == LYD_TYPE_DATA_YANG) {
          if (pplStack_38 == (lyd_node **)0x0) {
            local_d0 = (lyd_node **)0x0;
          }
          else {
            local_d0 = &diff_parent;
          }
          prev_lo._4_4_ =
               lyd_validate_all(&dep_tree_local,(ly_ctx *)0x0,(uint32_t)diff_local | 2,local_d0);
        }
        else {
          if (pplStack_38 == (lyd_node **)0x0) {
            local_f0 = (lyd_node **)0x0;
          }
          else {
            local_f0 = &diff_parent;
          }
          prev_lo._4_4_ = lyd_validate_op(ext_diff,_val_opts_local,diff_local._4_4_,local_f0);
        }
        ly_temp_log_options(_i);
        for (err._0_4_ = 0; (uint)err < local_a0->count; err._0_4_ = (uint)err + 1) {
          if ((local_a0->field_2).dnodes[(uint)err] == dep_tree_local) {
            dep_tree_local = dep_tree_local->next;
          }
          lyd_free_tree((local_a0->field_2).dnodes[(uint)err]);
        }
        for (ext_data = dep_tree_local; ext_data != (lyd_node *)0x0; ext_data = ext_data->next) {
          ext_data->flags = ext_data->flags | 8;
        }
        lyplg_ext_insert(op_tree,dep_tree_local);
        if (prev_lo._4_4_ == LY_SUCCESS) {
          if ((pplStack_38 != (lyd_node **)0x0) && (diff_parent != (lyd_node *)0x0)) {
            for (ext_data = diff_parent; ext_data != (lyd_node *)0x0; ext_data = ext_data->next) {
              ext_data->flags = ext_data->flags | 8;
            }
            plVar2 = lyd_parent(dep_tree_local);
            prev_lo._4_4_ = lyd_dup_single(plVar2,(lyd_node_inner *)0x0,6,&stack0xffffffffffffff70);
            if ((prev_lo._4_4_ == LY_SUCCESS) &&
               (prev_lo._4_4_ = lyplg_ext_insert(plStack_90,diff_parent),
               prev_lo._4_4_ == LY_SUCCESS)) {
              diff_parent = (lyd_node *)0x0;
              prev_lo._4_4_ = 0;
              while (plVar2 = lyd_parent(plStack_90), plVar2 != (lyd_node *)0x0) {
                plStack_90 = lyd_parent(plStack_90);
              }
              if (plStack_90->schema == (lysc_node *)0x0) {
                local_100 = (ly_ctx *)plStack_90[2].schema;
              }
              else {
                local_100 = plStack_90->schema->module->ctx;
              }
              prev_lo._4_4_ =
                   lyd_new_meta(local_100,plStack_90,(lys_module *)0x0,"yang:operation","none",0,
                                (lyd_meta **)0x0);
              if (prev_lo._4_4_ == LY_SUCCESS) {
                prev_lo._4_4_ = lyd_diff_merge_all(pplStack_38,plStack_90,1);
              }
            }
          }
        }
        else {
          if (dep_tree_local->schema == (lysc_node *)0x0) {
            local_f8 = (ly_ctx *)dep_tree_local[2].schema;
          }
          else {
            local_f8 = dep_tree_local->schema->module->ctx;
          }
          iter = (lyd_node *)ly_err_first(local_f8);
          if ((ly_err_item *)iter == (ly_err_item *)0x0) {
            lyplg_ext_compile_log
                      ((lysc_ctx *)0x0,(lysc_ext_instance *)sibling_local,LY_LLERR,prev_lo._4_4_,
                       "Unknown validation error (err code %d).",(ulong)prev_lo._4_4_);
          }
          else {
            lyplg_ext_compile_log_err((ly_err_item *)iter,(lysc_ext_instance *)sibling_local);
          }
        }
      }
    }
  }
LAB_0020984b:
  ly_set_free(local_a0,(_func_void_void_ptr *)0x0);
  lyd_free_siblings(orig_parent);
  lyd_free_tree(diff_parent);
  lyd_free_all(plStack_90);
  if (ref_set._7_1_ != '\0') {
    lyd_free_all(ref_first);
  }
  return prev_lo._4_4_;
}

Assistant:

static LY_ERR
schema_mount_validate(struct lysc_ext_instance *ext, struct lyd_node *sibling, const struct lyd_node *dep_tree,
        enum lyd_type data_type, uint32_t val_opts, struct lyd_node **diff)
{
    LY_ERR ret = LY_SUCCESS;
    uint32_t *prev_lo, temp_lo = LY_LOSTORE_LAST, i;
    const struct ly_err_item *err;
    struct lyd_node *iter, *ext_data = NULL, *ref_first = NULL, *orig_parent = lyd_parent(sibling), *op_tree;
    struct lyd_node *ext_diff = NULL, *diff_parent = NULL;
    ly_bool ext_data_free = 0;
    struct ly_set *ref_set = NULL;

    if (!sibling) {
        /* some data had to be parsed for this callback to be called */
        EXT_LOGERR_INT_RET(NULL, ext);
    }

    /* get operational data with ietf-yang-library and ietf-yang-schema-mount data */
    if ((ret = lyplg_ext_get_data(ext->module->ctx, ext, (void **)&ext_data, &ext_data_free))) {
        goto cleanup;
    }

    LY_LIST_FOR(ext_data, iter) {
        if (iter->flags & LYD_NEW) {
            /* must be validated for the parent-reference prefix data to be stored */
            lyplg_ext_compile_log(NULL, ext, LY_LLERR, LY_EINVAL, "Provided ext data have not been validated.");
            ret = LY_EINVAL;
            goto cleanup;
        }
    }

    /* duplicate the referenced parent nodes into ext context */
    if ((ret = schema_mount_dup_parent_ref(ext, orig_parent, ext_data, LYD_CTX(sibling), &ref_set))) {
        goto cleanup;
    }

    if (data_type != LYD_TYPE_DATA_YANG) {
        /* remember the operation data tree, it may be moved */
        op_tree = sibling;
    }

    /* create accessible tree, remove LYD_EXT to not call this callback recursively */
    LY_CHECK_GOTO(lyd_unlink_siblings(sibling), cleanup);
    LY_LIST_FOR(sibling, iter) {
        iter->flags &= ~LYD_EXT;
    }
    if (ref_set->count) {
        if ((ret = lyd_insert_sibling(sibling, ref_set->dnodes[0], &sibling))) {
            goto cleanup;
        }
    }

    /* only store messages in the context, log as an extension */
    prev_lo = ly_temp_log_options(&temp_lo);

    if (data_type == LYD_TYPE_DATA_YANG) {
        /* validate all the modules with data */
        ret = lyd_validate_all(&sibling, NULL, val_opts | LYD_VALIDATE_PRESENT, diff ? &ext_diff : NULL);
    } else {
        /* validate the operation */
        ret = lyd_validate_op(op_tree, dep_tree, data_type, diff ? &ext_diff : NULL);
    }

    /* restore logging */
    ly_temp_log_options(prev_lo);

    /* restore sibling tree */
    for (i = 0; i < ref_set->count; ++i) {
        if (ref_set->dnodes[i] == sibling) {
            sibling = sibling->next;
        }
        lyd_free_tree(ref_set->dnodes[i]);
    }
    LY_LIST_FOR(sibling, iter) {
        iter->flags |= LYD_EXT;
    }
    lyplg_ext_insert(orig_parent, sibling);

    if (ret) {
        /* log the error in the original context */
        err = ly_err_first(LYD_CTX(sibling));
        if (!err) {
            lyplg_ext_compile_log(NULL, ext, LY_LLERR, ret, "Unknown validation error (err code %d).", ret);
        } else {
            lyplg_ext_compile_log_err(err, ext);
        }
        goto cleanup;
    }

    /* create proper diff */
    if (diff && ext_diff) {
        /* diff nodes from an extension instance */
        LY_LIST_FOR(ext_diff, iter) {
            iter->flags |= LYD_EXT;
        }

        /* create the parent and insert the diff */
        if ((ret = lyd_dup_single(lyd_parent(sibling), NULL, LYD_DUP_WITH_PARENTS | LYD_DUP_NO_META, &diff_parent))) {
            goto cleanup;
        }
        if ((ret = lyplg_ext_insert(diff_parent, ext_diff))) {
            goto cleanup;
        }
        ext_diff = NULL;

        /* go top-level and set the operation */
        while (lyd_parent(diff_parent)) {
            diff_parent = lyd_parent(diff_parent);
        }
        if ((ret = lyd_new_meta(LYD_CTX(diff_parent), diff_parent, NULL, "yang:operation", "none", 0, NULL))) {
            goto cleanup;
        }

        /* finally merge into the global diff */
        if ((ret = lyd_diff_merge_all(diff, diff_parent, LYD_DIFF_MERGE_DEFAULTS))) {
            goto cleanup;
        }
    }

cleanup:
    ly_set_free(ref_set, NULL);
    lyd_free_siblings(ref_first);
    lyd_free_tree(ext_diff);
    lyd_free_all(diff_parent);
    if (ext_data_free) {
        lyd_free_all(ext_data);
    }
    return ret;
}